

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::timestamp_t,duckdb::dtime_tz_t>
          (BaseAppender *this,Vector *col,timestamp_t input)

{
  dtime_tz_t dVar1;
  
  dVar1 = Cast::Operation<duckdb::timestamp_t,duckdb::dtime_tz_t>(input);
  *(uint64_t *)(col->data + (this->chunk).count * 8) = dVar1.bits;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}